

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

char ** apprun_env_item_list_to_envp(apprun_env_item_list_t *list)

{
  uint uVar1;
  char **ppcVar2;
  char *pcVar3;
  char *pcVar4;
  char *env_entry_2;
  char *env_entry_1;
  char *env_entry;
  apprun_env_item_t *item;
  apprun_env_item_list_t *itr;
  uint count;
  char **envp;
  uint envp_len;
  apprun_env_item_list_t *list_local;
  
  uVar1 = apprun_env_item_list_to_envp_len(list);
  ppcVar2 = (char **)calloc((ulong)(uVar1 + 1),8);
  itr._4_4_ = 0;
  for (item = (apprun_env_item_t *)list; item->name != (char *)0x0;
      item = (apprun_env_item_t *)&item->current_value) {
    pcVar4 = item->name;
    if (*(long *)(pcVar4 + 8) != 0) {
      pcVar3 = apprun_env_envp_entry_create((char *)0x0,*(char **)pcVar4,*(char **)(pcVar4 + 8));
      ppcVar2[itr._4_4_] = pcVar3;
      itr._4_4_ = itr._4_4_ + 1;
    }
    if (*(long *)(pcVar4 + 0x10) != 0) {
      pcVar3 = apprun_env_envp_entry_create
                         ("APPRUN_ORIGINAL_",*(char **)pcVar4,*(char **)(pcVar4 + 0x10));
      ppcVar2[itr._4_4_] = pcVar3;
      itr._4_4_ = itr._4_4_ + 1;
    }
    if (*(long *)(pcVar4 + 0x18) != 0) {
      pcVar4 = apprun_env_envp_entry_create
                         ("APPRUN_STARTUP_",*(char **)pcVar4,*(char **)(pcVar4 + 0x18));
      ppcVar2[itr._4_4_] = pcVar4;
      itr._4_4_ = itr._4_4_ + 1;
    }
  }
  return ppcVar2;
}

Assistant:

char **apprun_env_item_list_to_envp(apprun_env_item_list_t *list) {
    unsigned int envp_len = apprun_env_item_list_to_envp_len(list);

    // Allocate an extra space for NULL termination
    char **envp = calloc(envp_len + 1, sizeof(char *));
    unsigned count = 0;

    for (apprun_env_item_list_t *itr = list; *itr != NULL; itr++) {
        apprun_env_item_t *item = *itr;
        if (item->current_value != NULL) {
            char *env_entry = apprun_env_envp_entry_create(NULL, item->name, item->current_value);
            envp[count] = env_entry;
            count++;
        }

        if (item->original_value != NULL) {
            char *env_entry = apprun_env_envp_entry_create(APPRUN_ENV_ORIG_PREFIX, item->name,
                                                           item->original_value);
            envp[count] = env_entry;
            count++;
        }

        if (item->startup_value != NULL) {
            char *env_entry = apprun_env_envp_entry_create(APPRUN_ENV_STARTUP_PREFIX, item->name,
                                                           item->startup_value);
            envp[count] = env_entry;
            count++;
        }
    }

    return envp;
}